

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-softmaxes.cc
# Opt level: O1

void __thiscall
dynet::SparsemaxLoss::forward_dev_impl<dynet::Device_CPU>
          (SparsemaxLoss *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  float *pfVar1;
  Tensor *pTVar2;
  void *pvVar3;
  StoragePointerType pfVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  runtime_error *prVar7;
  ulong uVar8;
  array<long,_1> aVar9;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  array<long,_1> aVar13;
  long lVar14;
  _Type alVar15;
  float *pfVar16;
  StoragePointerType pfVar17;
  long lVar18;
  uint uVar19;
  float fVar20;
  CoeffReturnType CVar21;
  CoeffReturnType CVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  SumReducer<float> reducer;
  ostringstream oss;
  undefined1 local_21e [2];
  float local_21c;
  Tensor *local_218;
  float local_20c;
  float *local_208 [2];
  _Type local_1f8;
  undefined1 local_1f0 [24];
  array<long,_1> local_1d8;
  array<Index,_NumReducedDims> local_1d0;
  array<Index,_NumReducedDims> local_1c8;
  bind2nd_op<Eigen::internal::scalar_product_op<float,_float>_> local_1c0;
  DefaultDevice *local_1b0;
  ulong local_1a8;
  _Type local_1a0;
  Dimensions local_198;
  Dimensions local_190;
  _Type local_188;
  Dimensions local_178;
  EvaluatorPointerType local_120;
  DefaultDevice *local_118;
  StoragePointerType local_90;
  Dimensions local_88;
  StoragePointerType local_80;
  Dimensions local_78;
  scalar_constant_op<float> local_70;
  float *local_60;
  Dimensions local_58;
  bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_> local_48;
  
  pTVar2 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_218 = fx;
  if ((1 < (pTVar2->d).nd) && ((pTVar2->d).d[1] != 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"SparsemaxLoss not yet implemented for multiple columns",0x36);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)&local_90);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar19 = (pTVar2->d).d[0];
  if (0x10000 < (long)(int)uVar19) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               "MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.",0x47);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)&local_90);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar12 = (ulong)((long)(this->pq->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->pq->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start) >> 2;
  iVar11 = (int)uVar12;
  local_20c = (float)(uVar12 & 0xffffffff);
  pvVar3 = (this->super_Node).aux_mem;
  local_21c = 1.0 / local_20c;
  std::__partial_sort_copy<float*,float*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<float>>>
            (pTVar2->v,pTVar2->v + (int)uVar19,pvVar3);
  uVar8 = 0;
  uVar12 = 0;
  if (0 < (int)uVar19) {
    uVar12 = (ulong)uVar19;
  }
  fVar23 = 0.0;
  fVar20 = 0.0;
  do {
    if (uVar12 == uVar8) goto LAB_00402740;
    fVar24 = *(float *)((long)pvVar3 + uVar8 * 4);
    uVar8 = uVar8 + 1;
    fVar23 = fVar23 + fVar24;
    fVar24 = (float)(int)uVar8 * fVar24 + 1.0;
    uVar19 = -(uint)(fVar23 < fVar24);
    fVar20 = (float)(~uVar19 & (uint)fVar20 | uVar19 & (uint)fVar23);
  } while (fVar23 < fVar24);
  uVar12 = (ulong)((int)uVar8 - 1);
LAB_00402740:
  pTVar2 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar19 = 1;
  if ((pTVar2->d).nd != 0) {
    uVar19 = (pTVar2->d).d[0];
  }
  fVar20 = (fVar20 + -1.0) / (float)(int)uVar12;
  pfVar4 = (StoragePointerType)(this->super_Node).aux_mem;
  pfVar5 = pTVar2->v;
  aVar9._M_elems[0] = (_Type)(long)(int)uVar19;
  aVar13._M_elems[0] = (_Type)(_Type)((long)aVar9._M_elems[0] + 0xf);
  if (-1 < (long)aVar9._M_elems[0]) {
    aVar13._M_elems[0] = aVar9._M_elems[0];
  }
  uVar12 = (ulong)aVar13._M_elems[0] & 0xfffffffffffffff0;
  if (0xf < (int)uVar19) {
    lVar14 = 0;
    pfVar16 = pfVar5;
    pfVar17 = pfVar4;
    do {
      lVar18 = 0;
      do {
        pfVar1 = (float *)((long)pfVar16 + lVar18);
        auVar25._4_4_ = pfVar1[1] - fVar20;
        auVar25._0_4_ = *pfVar1 - fVar20;
        auVar25._8_4_ = pfVar1[2] - fVar20;
        auVar25._12_4_ = pfVar1[3] - fVar20;
        auVar25 = maxps(ZEXT816(0),auVar25);
        *(undefined1 (*) [16])((long)pfVar17 + lVar18) = auVar25;
        lVar18 = lVar18 + 0x10;
      } while (lVar18 != 0x40);
      lVar14 = lVar14 + 0x10;
      pfVar17 = pfVar17 + 0x10;
      pfVar16 = pfVar16 + 0x10;
    } while (lVar14 < (long)uVar12);
  }
  aVar13._M_elems[0] = (_Type)(_Type)((long)aVar9._M_elems[0] + 3);
  if (-1 < (long)aVar9._M_elems[0]) {
    aVar13._M_elems[0] = aVar9._M_elems[0];
  }
  alVar15[0] = aVar13._M_elems[0] & 0xfffffffffffffffc;
  for (; (long)uVar12 < alVar15[0]; uVar12 = uVar12 + 4) {
    pfVar16 = pfVar5 + uVar12;
    auVar6._4_4_ = pfVar16[1] - fVar20;
    auVar6._0_4_ = *pfVar16 - fVar20;
    auVar6._8_4_ = pfVar16[2] - fVar20;
    auVar6._12_4_ = pfVar16[3] - fVar20;
    auVar25 = maxps(ZEXT816(0),auVar6);
    *(undefined1 (*) [16])(pfVar4 + uVar12) = auVar25;
  }
  if (alVar15[0] < (long)aVar9._M_elems[0]) {
    if (pfVar5 == (float *)0x0) {
      pcVar10 = 
      "CoeffReturnType Eigen::TensorEvaluator<const Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeff(Index) const [Derived = const Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
      ;
      goto LAB_00402b8b;
    }
    if (pfVar4 == (StoragePointerType)0x0) {
      pcVar10 = 
      "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
      ;
      goto LAB_00402a5b;
    }
    do {
      fVar23 = 0.0;
      if (0.0 <= pfVar5[alVar15[0]] - fVar20) {
        fVar23 = pfVar5[alVar15[0]] - fVar20;
      }
      pfVar4[alVar15[0]] = fVar23;
      alVar15[0] = alVar15[0] + 1;
    } while (aVar9._M_elems[0] != (_Type)alVar15[0]);
  }
  pTVar2 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_60 = pTVar2->v;
  uVar19 = 1;
  if ((pTVar2->d).nd != 0) {
    uVar19 = (pTVar2->d).d[0];
  }
  local_58.super_array<long,_1>._M_elems[0] = (array<long,_1>)(long)(int)uVar19;
  local_48.m_value = fVar20 * fVar20;
  local_70.m_other = 0.0;
  local_208[0] = local_218->v;
  local_1f8[0] = (long)local_21e;
  local_90 = pfVar4;
  local_88.super_array<long,_1>._M_elems[0] = (array<long,_1>)(array<long,_1>)aVar9._M_elems[0];
  local_80 = pfVar4;
  local_78.super_array<long,_1>._M_elems[0] = (array<long,_1>)(array<long,_1>)aVar9._M_elems[0];
  Eigen::
  TensorEvaluator<const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
  ::TensorEvaluator((TensorEvaluator<const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
                     *)&local_1c0,(XprType *)&local_90,(DefaultDevice *)local_1f8[0]);
  local_120 = (EvaluatorPointerType)0x0;
  local_118 = (DefaultDevice *)local_21e;
  local_1f0[0] = 1;
  local_1c8._M_elems[0] = (_Type)(_Type)local_198.super_array<long,_1>._M_elems[0];
  local_1d0._M_elems[0] = (_Type)1;
  local_1f0._8_8_ = local_198.super_array<long,_1>._M_elems[0];
  local_1d8._M_elems[0] = (_Type)(_Type)local_198.super_array<long,_1>._M_elems[0];
  CVar21 = Eigen::internal::
           InnerMostDimReducer<Eigen::TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>,_Eigen::internal::SumReducer<float>,_true,_true>
           ::reduce((TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                     *)local_1f0,0,(Index)local_198.super_array<long,_1>._M_elems[0],
                    (SumReducer<float> *)(local_21e + 1));
  if (local_208[0] == (float *)0x0) {
LAB_00402a46:
    pcVar10 = 
    "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 0>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 0>>, Device = Eigen::DefaultDevice]"
    ;
LAB_00402a5b:
    __assert_fail("m_data != __null",
                  "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",100,
                  pcVar10);
  }
  *local_208[0] = CVar21;
  if (local_120 != (EvaluatorPointerType)0x0) {
    free(local_120);
    local_120 = (EvaluatorPointerType)0x0;
  }
  pfVar5 = local_218->v;
  if (pfVar5 != (float *)0x0) {
    *pfVar5 = (local_21c * local_21c * local_20c + *pfVar5) * 0.5;
    if (iVar11 != 0) {
      lVar14 = 0;
      do {
        pTVar2 = *(xs->
                  super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar19 = 1;
        if ((pTVar2->d).nd != 0) {
          uVar19 = (pTVar2->d).d[0];
        }
        local_208[0] = local_218->v;
        local_198.super_array<long,_1>._M_elems[0] = (array<long,_1>)pTVar2->v;
        local_190.super_array<long,_1>._M_elems[0] = (array<long,_1>)(long)(int)uVar19;
        uVar12 = (ulong)(this->pq->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[lVar14];
        local_1c0.m_value = local_21c;
        local_1f8[0] = (long)&local_90;
        local_1f0._0_8_ = &local_90;
        local_1f0._16_8_ = local_208[0];
        local_1d0._M_elems[0] = (_Type)(_Type)&local_90;
        local_1c8._M_elems[0] = (_Type)(_Type)&local_90;
        local_188[0] = (long)&local_90;
        local_178.super_array<long,_1>._M_elems[0] = (array<long,_1>)(array<long,_1>)&local_90;
        if ((long)local_190.super_array<long,_1>._M_elems[0] <= (long)uVar12) {
          __assert_fail("op.offset() < input_dims[m_dim.actualDim()]",
                        "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorChipping.h",
                        0xae,
                        "Eigen::TensorEvaluator<const Eigen::TensorChippingOp<0, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Eigen::DefaultDevice>::TensorEvaluator(const XprType &, const Device &) [Derived = const Eigen::TensorChippingOp<0, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Device = Eigen::DefaultDevice]"
                       );
        }
        local_1b0 = (DefaultDevice *)0x1;
        local_1a8 = uVar12;
        local_1a0[0] = (long)local_190.super_array<long,_1>._M_elems[0];
        CVar22 = Eigen::
                 TensorEvaluator<const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_product_op<float,_float>_>,_const_Eigen::TensorChippingOp<0L,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
                 ::coeff((TensorEvaluator<const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_product_op<float,_float>_>,_const_Eigen::TensorChippingOp<0L,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
                          *)local_1f0,0);
        if (local_208[0] == (float *)0x0) goto LAB_00402a46;
        *local_208[0] = CVar22;
        lVar14 = lVar14 + 1;
      } while (iVar11 != (int)lVar14);
    }
    pfVar5 = local_218->v;
    if (pfVar5 != (float *)0x0) {
      fVar20 = 0.0;
      if (0.0 <= *pfVar5) {
        fVar20 = *pfVar5;
      }
      *pfVar5 = fVar20;
      return;
    }
  }
  pcVar10 = 
  "CoeffReturnType Eigen::TensorEvaluator<const Eigen::TensorMap<Eigen::Tensor<float, 0>>, Eigen::DefaultDevice>::coeff(Index) const [Derived = const Eigen::TensorMap<Eigen::Tensor<float, 0>>, Device = Eigen::DefaultDevice]"
  ;
LAB_00402b8b:
  __assert_fail("m_data != __null",
                "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",0x123,
                pcVar10);
}

Assistant:

void SparsemaxLoss::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() == 1) {
#ifdef __CUDACC__
    DYNET_NO_CUDA_IMPL_ERROR("SparsemaxLoss forward");
#else
    const int rows = xs[0]->d.rows();
    if (rows > MAX_SPARSEMAX_LOSS_ROWS)
      DYNET_RUNTIME_ERR("MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.");
    const unsigned qsupport_size = pq->size();
    const float qprop = 1.f / qsupport_size;

    float *zs = static_cast<float*>(aux_mem);
    std::partial_sort_copy(xs[0]->v, xs[0]->v+rows, zs, zs + rows, std::greater<float>());
    float sum = 0, maxsum = 0;
    int k = 0;
    for (k = 0; k < rows; ++k) {
      sum += zs[k];
      float t = 1 + (k + 1) * zs[k];
      if (t <= sum) break;
      maxsum = sum;
    }
    float tau = (maxsum - 1) / k;
    Tensor tsm(xs[0]->d, (float*)aux_mem, xs[0]->device, DeviceMempool::FXS);
    tsm.t<1>() = (xs[0]->t<1>() - tau).cwiseMax(0.f);
    fx.t<0>() = ( (tsm.t<1>() != 0.f).cast<float>() * (xs[0]->t<1>().square() - (tau * tau)) ).sum();
    fx.t<0>() = ( fx.t<0>() + qprop * qprop * qsupport_size ) / 2.f;
    for (unsigned i = 0; i < qsupport_size; ++i)
      fx.t<0>() = fx.t<0>() - xs[0]->t<1>().chip<0>((*pq)[i]) * qprop;
    fx.t<0>() = fx.t<0>().cwiseMax(0.f);
#endif
  } else {
    DYNET_RUNTIME_ERR("SparsemaxLoss not yet implemented for multiple columns");
  }
}